

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O3

int pcre2_substring_list_get_16
              (pcre2_match_data_16 *match_data,PCRE2_UCHAR16 ***listptr,size_t **lengthsptr)

{
  undefined2 *puVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  PCRE2_UCHAR16 **ppPVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  size_t *__dest;
  size_t *psVar12;
  size_t *psVar13;
  bool local_49;
  ulong local_48;
  
  iVar4 = match_data->rc;
  uVar5 = (ulong)iVar4;
  if ((long)uVar5 < 0) {
    return iVar4;
  }
  if (iVar4 == 0) {
    uVar2 = match_data->oveccount;
    uVar5 = (ulong)uVar2;
    uVar11 = (ulong)((uint)uVar2 * 8);
    sVar9 = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      sVar9 = uVar11 + 0x20;
    }
    if (uVar2 == 0) {
      local_48 = 0;
      lVar10 = 8;
      bVar3 = true;
      goto LAB_0015f581;
    }
  }
  else {
    uVar11 = uVar5 * 8;
    sVar9 = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      sVar9 = uVar5 * 8 + 0x20;
    }
  }
  local_48 = (ulong)(uint)((int)uVar5 * 2);
  uVar7 = 0;
  do {
    lVar10 = (match_data->ovector[uVar7 + 1] - match_data->ovector[uVar7]) * 2;
    if (match_data->ovector[uVar7 + 1] <= match_data->ovector[uVar7]) {
      lVar10 = 0;
    }
    sVar9 = sVar9 + lVar10 + 10;
    uVar7 = uVar7 + 2;
  } while (uVar7 < local_48);
  lVar10 = (uVar5 & 0xffffffff) * 8 + 8;
  bVar3 = false;
LAB_0015f581:
  local_49 = lengthsptr == (size_t **)0x0;
  pvVar6 = _pcre2_memctl_malloc_16(sVar9,&match_data->memctl);
  if (pvVar6 == (void *)0x0) {
    iVar4 = -0x30;
  }
  else {
    ppPVar8 = (PCRE2_UCHAR16 **)((long)pvVar6 + 0x18);
    *listptr = ppPVar8;
    psVar13 = (size_t *)((long)pvVar6 + lVar10 + 0x18);
    if (local_49) {
      psVar12 = (size_t *)0x0;
      __dest = psVar13;
    }
    else {
      *lengthsptr = psVar13;
      __dest = (size_t *)(uVar11 + (long)psVar13);
      psVar12 = psVar13;
    }
    if (!bVar3) {
      lVar10 = 0;
      uVar5 = 0;
      do {
        uVar11 = match_data->ovector[uVar5];
        uVar7 = match_data->ovector[uVar5 + 1];
        sVar9 = 0;
        if (uVar11 <= uVar7) {
          sVar9 = uVar7 - uVar11;
        }
        if (uVar11 <= uVar7 && uVar7 - uVar11 != 0) {
          memcpy(__dest,match_data->subject + uVar11,sVar9 * 2);
        }
        *(size_t **)((long)ppPVar8 + uVar5 * 4) = __dest;
        if (psVar12 == (size_t *)0x0) {
          psVar12 = (size_t *)0x0;
        }
        else {
          *psVar12 = sVar9;
          psVar12 = psVar12 + 1;
        }
        puVar1 = (undefined2 *)((long)__dest + sVar9 * 2);
        __dest = (size_t *)(puVar1 + 1);
        *puVar1 = 0;
        uVar5 = uVar5 + 2;
        lVar10 = lVar10 + 8;
      } while (uVar5 < local_48);
      ppPVar8 = (PCRE2_UCHAR16 **)((long)ppPVar8 + lVar10);
    }
    *ppPVar8 = (PCRE2_UCHAR16 *)0x0;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}